

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

int IDASolveF(void *ida_mem,sunrealtype tout,sunrealtype *tret,N_Vector yret,N_Vector ypret,
             int itask,int *ncheckPtr)

{
  IDAdtpntMemRec **ppIVar1;
  int iVar2;
  IDAckpntMem pIVar3;
  N_Vector in_RCX;
  sunrealtype *in_RDX;
  double *in_RSI;
  IDAMem in_RDI;
  int in_R8D;
  int *in_R9;
  bool bVar4;
  void *in_XMM0_Qa;
  sunrealtype ttest;
  int earlyret;
  int allocOK;
  int i;
  int flag;
  long nstloc;
  IDAdtpntMem *dt_mem;
  IDAckpntMem tmp;
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDAMem in_stack_ffffffffffffff78;
  int local_70;
  int local_6c;
  long local_68;
  IDAadjMemRec *yret_00;
  undefined4 in_stack_ffffffffffffffc8;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x181,"IDASolveF",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_adjMallocDone == 0) {
    IDAProcessError(in_RDI,-0x65,0x18c,"IDASolveF",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,"Illegal attempt to call before calling IDAadjInit.");
    local_4 = -0x65;
  }
  else {
    yret_00 = in_RDI->ida_adj_mem;
    if (in_RDX == (sunrealtype *)0x0) {
      IDAProcessError(in_RDI,-0x16,0x196,"IDASolveF",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,"yret = NULL illegal.");
      local_4 = -0x16;
    }
    else if (in_RCX == (N_Vector)0x0) {
      IDAProcessError(in_RDI,-0x16,0x19f,"IDASolveF",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,"ypret = NULL illegal.");
      local_4 = -0x16;
    }
    else if (in_RSI == (double *)0x0) {
      IDAProcessError(in_RDI,-0x16,0x1a7,"IDASolveF",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,"tret = NULL illegal.");
      local_4 = -0x16;
    }
    else if ((in_R8D == 1) || (in_R8D == 2)) {
      ppIVar1 = yret_00->dt_mem;
      if (in_RDI->ida_tstopset != 0) {
        yret_00->ia_tstopIDAFcall = 1;
        yret_00->ia_tstopIDAF = in_RDI->ida_tstop;
      }
      if (yret_00->ia_firstIDAFcall == 0) {
        if (in_R8D == 1) {
          if (yret_00->ia_rootret == 0) {
            in_stack_ffffffffffffff78 = (IDAMem)in_RDI->ida_tn;
          }
          else {
            in_stack_ffffffffffffff78 = (IDAMem)yret_00->ia_troot;
          }
          if (((double)in_stack_ffffffffffffff78 - (double)in_XMM0_Qa) * in_RDI->ida_hh < 0.0) {
            bVar4 = yret_00->ia_rootret != 0;
            if (bVar4) {
              *in_RSI = yret_00->ia_troot;
              IDAGetSolution((void *)CONCAT44(1,in_stack_ffffffffffffffc8),(sunrealtype)in_R9,
                             (N_Vector)yret_00,(N_Vector)in_RDI);
              local_6c = 2;
              yret_00->ia_rootret = 0;
            }
          }
          else {
            *in_RSI = (double)in_XMM0_Qa;
            local_6c = IDAGetSolution((void *)CONCAT44(1,in_stack_ffffffffffffffc8),
                                      (sunrealtype)in_R9,(N_Vector)yret_00,(N_Vector)in_RDI);
            bVar4 = true;
          }
          if (bVar4) {
            *in_R9 = yret_00->ia_nckpnts;
            yret_00->ia_newData = 1;
            yret_00->ia_ckpntData = yret_00->ck_mem;
            yret_00->ia_np = in_RDI->ida_nst % yret_00->ia_nsteps + 1;
            return local_6c;
          }
        }
      }
      else {
        yret_00->ia_tinitial = (sunrealtype)in_RDI->ida_tn;
        pIVar3 = IDAAckpntInit(in_stack_ffffffffffffff78);
        yret_00->ck_mem = pIVar3;
        if (yret_00->ck_mem == (IDAckpntMemRec *)0x0) {
          IDAProcessError(in_RDI,-0x15,0x1ce,"IDASolveF",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                          ,"A memory request failed.");
          return -0x15;
        }
        if (yret_00->ia_mallocDone == 0) {
          if (in_RDI->ida_sensi == 0) {
            yret_00->ia_storeSensi = 0;
          }
          iVar2 = (*yret_00->ia_malloc)(in_RDI);
          if (iVar2 == 0) {
            IDAProcessError(in_RDI,-0x15,0x1dd,"IDASolveF",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                            ,"A memory request failed.");
            return -0x15;
          }
          for (local_70 = 0; local_70 < 6; local_70 = local_70 + 1) {
            yret_00->ia_Y[local_70] = in_RDI->ida_phi[local_70];
          }
          if (yret_00->ia_storeSensi != 0) {
            for (local_70 = 0; local_70 < 6; local_70 = local_70 + 1) {
              yret_00->ia_YS[local_70] = in_RDI->ida_phiS[local_70];
            }
          }
          yret_00->ia_mallocDone = 1;
        }
        (*ppIVar1)->t = yret_00->ck_mem->ck_t0;
        (*yret_00->ia_storePnt)(in_RDI,*ppIVar1);
        yret_00->ia_firstIDAFcall = 0;
      }
      local_68 = 0;
      while( true ) {
        if ((0 < in_RDI->ida_mxstep) && (in_RDI->ida_mxstep <= local_68)) {
          IDAProcessError((IDAMem)in_RDI->ida_tn,(int)in_RDI,-1,(char *)0x22a,"IDASolveF",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                          ,"At t = %.15g, mxstep steps taken before reaching tout.");
          local_6c = -1;
          goto LAB_00124a4b;
        }
        local_6c = IDASolve(in_XMM0_Qa,(sunrealtype)in_RSI,in_RDX,in_RCX,
                            (N_Vector)CONCAT44(in_R8D,in_stack_ffffffffffffffc8),
                            (int)((ulong)in_R9 >> 0x20));
        if (local_6c < 0) goto LAB_00124a4b;
        local_68 = local_68 + 1;
        if (in_RDI->ida_nst % yret_00->ia_nsteps == 0) {
          yret_00->ck_mem->ck_t1 = in_RDI->ida_tn;
          pIVar3 = IDAAckpntNew(in_stack_ffffffffffffff78);
          if (pIVar3 == (IDAckpntMem)0x0) {
            local_6c = -0x15;
            goto LAB_00124a4b;
          }
          pIVar3->ck_next = yret_00->ck_mem;
          yret_00->ck_mem = pIVar3;
          yret_00->ia_nckpnts = yret_00->ia_nckpnts + 1;
          in_RDI->ida_forceSetup = 1;
          (*ppIVar1)->t = yret_00->ck_mem->ck_t0;
          (*yret_00->ia_storePnt)(in_RDI,*ppIVar1);
        }
        else {
          ppIVar1[in_RDI->ida_nst % yret_00->ia_nsteps]->t = in_RDI->ida_tn;
          (*yret_00->ia_storePnt)(in_RDI,ppIVar1[in_RDI->ida_nst % yret_00->ia_nsteps]);
        }
        yret_00->ck_mem->ck_t1 = in_RDI->ida_tn;
        yret_00->ia_tfinal = in_RDI->ida_tn;
        if (in_R8D == 2) goto LAB_00124a4b;
        if (0.0 <= (*in_RSI - (double)in_XMM0_Qa) * in_RDI->ida_hh) break;
        if ((local_6c == 1) || (local_6c == 2)) goto LAB_00124a4b;
      }
      if (local_6c == 2) {
        yret_00->ia_rootret = 1;
        yret_00->ia_troot = *in_RSI;
      }
      *in_RSI = (double)in_XMM0_Qa;
      local_6c = IDAGetSolution((void *)CONCAT44(in_R8D,in_stack_ffffffffffffffc8),
                                (sunrealtype)in_R9,(N_Vector)yret_00,(N_Vector)in_RDI);
      in_RDI->ida_tretlast = (sunrealtype)in_XMM0_Qa;
LAB_00124a4b:
      *in_R9 = yret_00->ia_nckpnts;
      yret_00->ia_newData = 1;
      yret_00->ia_ckpntData = yret_00->ck_mem;
      yret_00->ia_np = in_RDI->ida_nst % yret_00->ia_nsteps + 1;
      local_4 = local_6c;
    }
    else {
      IDAProcessError(in_RDI,-0x16,0x1b0,"IDASolveF",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,"itask has an illegal value.");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int IDASolveF(void* ida_mem, sunrealtype tout, sunrealtype* tret, N_Vector yret,
              N_Vector ypret, int itask, int* ncheckPtr)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDAckpntMem tmp;
  IDAdtpntMem* dt_mem;
  long int nstloc;
  int flag, i;
  sunbooleantype allocOK, earlyret;
  sunrealtype ttest;

  /* Is the mem OK? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Is ASA initialized ? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check for yret != NULL */
  if (yret == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_YRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Check for ypret != NULL */
  if (ypret == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_YPRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }
  /* Check for tret != NULL */
  if (tret == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_TRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Check for valid itask */
  if ((itask != IDA_NORMAL) && (itask != IDA_ONE_STEP))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_ITASK);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* All memory checks done, proceed ... */

  dt_mem = IDAADJ_mem->dt_mem;

  /* If tstop is enabled, store some info */
  if (IDA_mem->ida_tstopset)
  {
    IDAADJ_mem->ia_tstopIDAFcall = SUNTRUE;
    IDAADJ_mem->ia_tstopIDAF     = IDA_mem->ida_tstop;
  }

  /* On the first step:
   *   - set tinitial
   *   - initialize list of check points
   *   - if needed, initialize the interpolation module
   *   - load dt_mem[0]
   * On subsequent steps, test if taking a new step is necessary.
   */
  if (IDAADJ_mem->ia_firstIDAFcall)
  {
    IDAADJ_mem->ia_tinitial = IDA_mem->ida_tn;
    IDAADJ_mem->ck_mem      = IDAAckpntInit(IDA_mem);
    if (IDAADJ_mem->ck_mem == NULL)
    {
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
      return (IDA_MEM_FAIL);
    }

    if (!IDAADJ_mem->ia_mallocDone)
    {
      /* Do we need to store sensitivities? */
      if (!IDA_mem->ida_sensi) { IDAADJ_mem->ia_storeSensi = SUNFALSE; }

      /* Allocate space for interpolation data */
      allocOK = IDAADJ_mem->ia_malloc(IDA_mem);
      if (!allocOK)
      {
        IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_MEM_FAIL);
        SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
        return (IDA_MEM_FAIL);
      }

      /* Rename phi and, if needed, phiS for use in interpolation */
      for (i = 0; i < MXORDP1; i++)
      {
        IDAADJ_mem->ia_Y[i] = IDA_mem->ida_phi[i];
      }
      if (IDAADJ_mem->ia_storeSensi)
      {
        for (i = 0; i < MXORDP1; i++)
        {
          IDAADJ_mem->ia_YS[i] = IDA_mem->ida_phiS[i];
        }
      }

      IDAADJ_mem->ia_mallocDone = SUNTRUE;
    }

    dt_mem[0]->t = IDAADJ_mem->ck_mem->ck_t0;
    IDAADJ_mem->ia_storePnt(IDA_mem, dt_mem[0]);

    IDAADJ_mem->ia_firstIDAFcall = SUNFALSE;
  }
  else if (itask == IDA_NORMAL)
  {
    /* When in normal mode, check if tout was passed or if a previous root was
       not reported and return an interpolated solution. No changes to ck_mem
       or dt_mem are needed. */

    /* flag to signal if an early return is needed */
    earlyret = SUNFALSE;

    /* if a root needs to be reported compare tout to troot otherwise compare
       to the current time tn */
    ttest = (IDAADJ_mem->ia_rootret) ? IDAADJ_mem->ia_troot : IDA_mem->ida_tn;

    if ((ttest - tout) * IDA_mem->ida_hh >= ZERO)
    {
      /* ttest is after tout, interpolate to tout */
      *tret    = tout;
      flag     = IDAGetSolution(IDA_mem, tout, yret, ypret);
      earlyret = SUNTRUE;
    }
    else if (IDAADJ_mem->ia_rootret)
    {
      /* tout is after troot, interpolate to troot */
      *tret = IDAADJ_mem->ia_troot;
      flag  = IDAGetSolution(IDA_mem, IDAADJ_mem->ia_troot, yret, ypret);
      flag  = IDA_ROOT_RETURN;
      IDAADJ_mem->ia_rootret = SUNFALSE;
      earlyret               = SUNTRUE;
    }

    /* return if necessary */
    if (earlyret)
    {
      *ncheckPtr               = IDAADJ_mem->ia_nckpnts;
      IDAADJ_mem->ia_newData   = SUNTRUE;
      IDAADJ_mem->ia_ckpntData = IDAADJ_mem->ck_mem;
      IDAADJ_mem->ia_np        = IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps + 1;
      SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
      return (flag);
    }
  }

  /* Integrate to tout (in IDA_ONE_STEP mode) while loading check points */
  nstloc = 0;
  for (;;)
  {
    /* Check for too many steps */

    if ((IDA_mem->ida_mxstep > 0) && (nstloc >= IDA_mem->ida_mxstep))
    {
      IDAProcessError(IDA_mem, IDA_TOO_MUCH_WORK, __LINE__, __func__, __FILE__,
                      MSG_MAX_STEPS, IDA_mem->ida_tn);
      flag = IDA_TOO_MUCH_WORK;
      break;
    }

    /* Perform one step of the integration */

    flag = IDASolve(IDA_mem, tout, tret, yret, ypret, IDA_ONE_STEP);
    if (flag < 0) { break; }

    nstloc++;

    /* Test if a new check point is needed */

    if (IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps == 0)
    {
      IDAADJ_mem->ck_mem->ck_t1 = IDA_mem->ida_tn;

      /* Create a new check point, load it, and append it to the list */
      tmp = IDAAckpntNew(IDA_mem);
      if (tmp == NULL)
      {
        flag = IDA_MEM_FAIL;
        break;
      }

      tmp->ck_next       = IDAADJ_mem->ck_mem;
      IDAADJ_mem->ck_mem = tmp;
      IDAADJ_mem->ia_nckpnts++;

      IDA_mem->ida_forceSetup = SUNTRUE;

      /* Reset i=0 and load dt_mem[0] */
      dt_mem[0]->t = IDAADJ_mem->ck_mem->ck_t0;
      IDAADJ_mem->ia_storePnt(IDA_mem, dt_mem[0]);
    }
    else
    {
      /* Load next point in dt_mem */
      dt_mem[IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps]->t = IDA_mem->ida_tn;
      IDAADJ_mem->ia_storePnt(IDA_mem,
                              dt_mem[IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps]);
    }

    /* Set t1 field of the current check point structure
       for the case in which there will be no future
       check points */
    IDAADJ_mem->ck_mem->ck_t1 = IDA_mem->ida_tn;

    /* tfinal is now set to tn */
    IDAADJ_mem->ia_tfinal = IDA_mem->ida_tn;

    /* Return if in IDA_ONE_STEP mode */
    if (itask == IDA_ONE_STEP) { break; }

    /* IDA_NORMAL_STEP returns */

    /* Return if tout reached */
    if ((*tret - tout) * IDA_mem->ida_hh >= ZERO)
    {
      /* If this was a root return, save the root time to return later */
      if (flag == IDA_ROOT_RETURN)
      {
        IDAADJ_mem->ia_rootret = SUNTRUE;
        IDAADJ_mem->ia_troot   = *tret;
      }

      /* Get solution value at tout to return now */
      *tret = tout;
      flag  = IDAGetSolution(IDA_mem, tout, yret, ypret);

      /* Reset tretlast in IDA_mem so that IDAGetQuad and IDAGetSens
       * evaluate quadratures and/or sensitivities at the proper time */
      IDA_mem->ida_tretlast = tout;

      break;
    }

    /* Return if tstop or a root was found */
    if ((flag == IDA_TSTOP_RETURN) || (flag == IDA_ROOT_RETURN)) { break; }

  } /* end of for(;;) */

  /* Get ncheck from IDAADJ_mem */
  *ncheckPtr = IDAADJ_mem->ia_nckpnts;

  /* Data is available for the last interval */
  IDAADJ_mem->ia_newData   = SUNTRUE;
  IDAADJ_mem->ia_ckpntData = IDAADJ_mem->ck_mem;
  IDAADJ_mem->ia_np        = IDA_mem->ida_nst % IDAADJ_mem->ia_nsteps + 1;

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (flag);
}